

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache_ptr.cc
# Opt level: O0

ThreadCache * tcmalloc::ThreadCachePtr::ReleaseAndClear(void)

{
  ThreadCache *pTVar1;
  ThreadCache *cache;
  
  pTVar1 = GetIfPresent();
  if (pTVar1 != (ThreadCache *)0x0) {
    ClearCacheTLS();
    SetTlsValue(tls_key_,(void *)0x0);
  }
  return pTVar1;
}

Assistant:

ThreadCache* ThreadCachePtr::ReleaseAndClear() {
  ThreadCache* cache = GetIfPresent();

  if (cache) {
    ClearCacheTLS();
    SetTlsValue(tls_key_, nullptr);
  }
  return cache;
}